

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unarc.c
# Opt level: O3

char prompt_user(char *filename)

{
  uint uVar1;
  ssize_t sVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  char buffer [80];
  
  do {
    fprintf(_stderr,"\n\"%s\" exists, overwrite ? (Yes/No/All/Rename): ",filename);
    fflush(_stderr);
    sVar2 = read(0,buffer,0x4f);
    if (sVar2 < 1) {
      uVar5 = 0x6e;
      break;
    }
    ppuVar3 = __ctype_b_loc();
    uVar5 = (ulong)buffer[0];
    if ((*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 1) != 0) {
      pp_Var4 = __ctype_tolower_loc();
      uVar5 = (ulong)(uint)(*pp_Var4)[uVar5];
    }
    uVar1 = (int)uVar5 - 0x61;
  } while ((0x18 < uVar1) || ((0x1022001U >> (uVar1 & 0x1f) & 1) == 0));
  return (char)uVar5;
}

Assistant:

char
prompt_user(char *filename)
{
	int c;
	char buffer[80];

	while (1)
	{
		fprintf(stderr, "\n\"%s\" exists, overwrite ? (Yes/No/All/Rename): ",
			   filename);
		fflush(stderr);
		if (read(0, buffer, sizeof(buffer) - 1)<1) {
			c = 'n';
			break;
		}
		if (isupper(*buffer))
			c = tolower(*buffer);
		else
			c = *buffer;
		if (c == 'y' || c == 'n' || c == 'a' || c == 'r')
			break;
	}
	return (c);
}